

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O0

void test_bson_steal(void)

{
  byte bVar1;
  uint32_t len_le;
  size_t len;
  uint8_t *buf;
  uint8_t *alloc;
  bson_t dst;
  bson_t *heap_alloced;
  bson_t stack_alloced;
  undefined8 local_298;
  undefined4 *local_290;
  long local_288;
  uint local_280 [12];
  long local_250;
  code *local_240;
  long local_238;
  bson_t *local_188;
  bson_t local_180 [2];
  
  bson_init(local_180);
  bson_append_int32(local_180,"a",1);
  bVar1 = bson_steal(local_280,local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x712,"test_bson_steal","bson_steal (&dst, &stack_alloced)");
    abort();
  }
  bVar1 = bson_has_field(local_280,"a");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x713,"test_bson_steal","bson_has_field (&dst, \"a\")");
    abort();
  }
  if ((local_280[0] & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x714,"test_bson_steal","dst.flags & BSON_FLAG_INLINE");
    abort();
  }
  bVar1 = bson_validate(local_180,0,0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x716,"test_bson_steal","!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0)");
    abort();
  }
  bson_destroy(local_280);
  bson_init(local_180);
  bloat(local_180);
  local_288._0_1_ = local_180[0].padding[0x28];
  local_288._1_1_ = local_180[0].padding[0x29];
  local_288._2_1_ = local_180[0].padding[0x2a];
  local_288._3_1_ = local_180[0].padding[0x2b];
  local_288._4_1_ = local_180[0].padding[0x2c];
  local_288._5_1_ = local_180[0].padding[0x2d];
  local_288._6_1_ = local_180[0].padding[0x2e];
  local_288._7_1_ = local_180[0].padding[0x2f];
  bVar1 = bson_steal(local_280,local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x71d,"test_bson_steal","bson_steal (&dst, &stack_alloced)");
    abort();
  }
  if (local_288 != local_250) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x71f,"test_bson_steal","alloc == ((bson_impl_alloc_t *) &dst)->alloc");
    abort();
  }
  bVar1 = bson_has_field(local_280,"99");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x720,"test_bson_steal","bson_has_field (&dst, \"99\")");
    abort();
  }
  if ((local_280[0] & 1) != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x721,"test_bson_steal","!(dst.flags & BSON_FLAG_INLINE)");
    abort();
  }
  bVar1 = bson_validate(local_180,0,0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x722,"test_bson_steal","!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0)");
    abort();
  }
  bson_destroy(local_280);
  local_188 = (bson_t *)bson_new();
  bson_append_int32(local_188,"a",1);
  bVar1 = bson_steal(local_280,local_188);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x728,"test_bson_steal","bson_steal (&dst, heap_alloced)");
    abort();
  }
  bVar1 = bson_has_field(local_280,"a");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x729,"test_bson_steal","bson_has_field (&dst, \"a\")");
    abort();
  }
  if ((local_280[0] & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x72a,"test_bson_steal","dst.flags & BSON_FLAG_INLINE");
    abort();
  }
  bson_destroy(local_280);
  local_188 = (bson_t *)bson_new();
  bloat(local_188);
  local_288 = *(long *)(local_188->padding + 0x28);
  bVar1 = bson_steal(local_280,local_188);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x731,"test_bson_steal","bson_steal (&dst, heap_alloced)");
    abort();
  }
  if (local_288 != local_250) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x733,"test_bson_steal","alloc == ((bson_impl_alloc_t *) &dst)->alloc");
    abort();
  }
  bVar1 = bson_has_field(local_280,"99");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x734,"test_bson_steal","bson_has_field (&dst, \"99\")");
    abort();
  }
  if ((local_280[0] & 1) != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x735,"test_bson_steal","!(dst.flags & BSON_FLAG_INLINE)");
    abort();
  }
  bson_destroy(local_280);
  local_290 = (undefined4 *)bson_malloc0(5);
  local_298 = 5;
  *local_290 = 5;
  local_188 = (bson_t *)bson_new_from_buffer(&local_290,&local_298,bson_realloc_ctx,0);
  bVar1 = bson_steal(local_280,local_188);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x73e,"test_bson_steal","bson_steal (&dst, heap_alloced)");
    abort();
  }
  if ((local_280[0] & 0x20) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x73f,"test_bson_steal","dst.flags & BSON_FLAG_NO_FREE");
    abort();
  }
  if ((local_280[0] & 2) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x740,"test_bson_steal","dst.flags & BSON_FLAG_STATIC");
    abort();
  }
  if (local_240 != bson_realloc_ctx) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x741,"test_bson_steal","((bson_impl_alloc_t *) &dst)->realloc == bson_realloc_ctx");
    abort();
  }
  if (local_238 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x742,"test_bson_steal","((bson_impl_alloc_t *) &dst)->realloc_func_ctx == NULL");
    abort();
  }
  bson_destroy(local_280);
  bson_free(local_290);
  return;
}

Assistant:

static void
test_bson_steal (void)
{
   bson_t stack_alloced;
   bson_t *heap_alloced;
   bson_t dst;
   uint8_t *alloc;
   uint8_t *buf;
   size_t len;
   uint32_t len_le;

   /* inline, stack-allocated */
   bson_init (&stack_alloced);
   BSON_APPEND_INT32 (&stack_alloced, "a", 1);
   ASSERT (bson_steal (&dst, &stack_alloced));
   ASSERT (bson_has_field (&dst, "a"));
   ASSERT (dst.flags & BSON_FLAG_INLINE);
   /* src was invalidated */
   ASSERT (!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0));
   bson_destroy (&dst);

   /* spilled over, stack-allocated */
   bson_init (&stack_alloced);
   bloat (&stack_alloced);
   alloc = ((bson_impl_alloc_t *) &stack_alloced)->alloc;
   ASSERT (bson_steal (&dst, &stack_alloced));
   /* data was transferred */
   ASSERT (alloc == ((bson_impl_alloc_t *) &dst)->alloc);
   ASSERT (bson_has_field (&dst, "99"));
   ASSERT (!(dst.flags & BSON_FLAG_INLINE));
   ASSERT (!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0));
   bson_destroy (&dst);

   /* inline, heap-allocated */
   heap_alloced = bson_new ();
   BSON_APPEND_INT32 (heap_alloced, "a", 1);
   ASSERT (bson_steal (&dst, heap_alloced));
   ASSERT (bson_has_field (&dst, "a"));
   ASSERT (dst.flags & BSON_FLAG_INLINE);
   bson_destroy (&dst);

   /* spilled over, heap-allocated */
   heap_alloced = bson_new ();
   bloat (heap_alloced);
   alloc = ((bson_impl_alloc_t *) heap_alloced)->alloc;
   ASSERT (bson_steal (&dst, heap_alloced));
   /* data was transferred */
   ASSERT (alloc == ((bson_impl_alloc_t *) &dst)->alloc);
   ASSERT (bson_has_field (&dst, "99"));
   ASSERT (!(dst.flags & BSON_FLAG_INLINE));
   bson_destroy (&dst);

   /* test stealing from a bson created with bson_new_from_buffer */
   buf = bson_malloc0 (5);
   len = 5;
   len_le = BSON_UINT32_TO_LE (5);
   memcpy (buf, &len_le, sizeof (len_le));
   heap_alloced = bson_new_from_buffer (&buf, &len, bson_realloc_ctx, NULL);
   ASSERT (bson_steal (&dst, heap_alloced));
   ASSERT (dst.flags & BSON_FLAG_NO_FREE);
   ASSERT (dst.flags & BSON_FLAG_STATIC);
   ASSERT (((bson_impl_alloc_t *) &dst)->realloc == bson_realloc_ctx);
   ASSERT (((bson_impl_alloc_t *) &dst)->realloc_func_ctx == NULL);
   bson_destroy (&dst);
   bson_free (buf);
}